

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O2

void __thiscall
jsoncons::
basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::write_bigint_value
          (basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           *this,string_view_type *sv)

{
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar1;
  bignum_format_kind bVar2;
  bool bVar3;
  type_conflict2 tVar4;
  int signum;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  bigint n;
  basic_bigint<std::allocator<unsigned_char>_> local_70;
  basic_bigint<std::allocator<unsigned_char>_> local_48;
  
  bVar2 = (this->options_).bignum_format_;
  if (bVar2 == base64url) {
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>(&n,sv->_M_str,sv->_M_len);
    bVar3 = jsoncons::operator<(&n,0);
    if (bVar3) {
      basic_bigint<std::allocator<unsigned_char>_>::operator-(&local_70,&n);
      operator-((basic_bigint<std::allocator<unsigned_char>_> *)&v,&local_70,1);
      basic_bigint<std::allocator<unsigned_char>_>::operator=
                (&n,(basic_bigint<std::allocator<unsigned_char>_> *)&v);
      basic_bigint<std::allocator<unsigned_char>_>::destroy
                ((basic_bigint<std::allocator<unsigned_char>_> *)&v);
      basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_70);
    }
    v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    basic_bigint<std::allocator<unsigned_char>>::write_bytes_be<std::allocator<unsigned_char>>
              ((basic_bigint<std::allocator<unsigned_char>> *)&n,&signum,&v);
    psVar1 = &this->sink_;
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(psVar1,'\"');
    if (bVar3) {
      string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::push_back(psVar1,'~');
      this->column_ = this->column_ + 1;
    }
    tVar4 = encode_base64url<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::string_sink<std::__cxx11::string>>
                      ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_finish,psVar1);
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(psVar1,'\"');
  }
  else {
    if (bVar2 != base64) {
      if (bVar2 == number) {
        string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::append(&this->sink_,sv->_M_str,sv->_M_len);
        this->column_ = this->column_ + sv->_M_len;
        return;
      }
      psVar1 = &this->sink_;
      string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::push_back(psVar1,'\"');
      string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::append(psVar1,sv->_M_str,sv->_M_len);
      string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::push_back(psVar1,'\"');
      this->column_ = sv->_M_len + this->column_ + 2;
      return;
    }
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>(&n,sv->_M_str,sv->_M_len);
    bVar3 = jsoncons::operator<(&n,0);
    if (bVar3) {
      basic_bigint<std::allocator<unsigned_char>_>::operator-(&local_48,&n);
      operator-((basic_bigint<std::allocator<unsigned_char>_> *)&v,&local_48,1);
      basic_bigint<std::allocator<unsigned_char>_>::operator=
                (&n,(basic_bigint<std::allocator<unsigned_char>_> *)&v);
      basic_bigint<std::allocator<unsigned_char>_>::destroy
                ((basic_bigint<std::allocator<unsigned_char>_> *)&v);
      basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_48);
    }
    v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    basic_bigint<std::allocator<unsigned_char>>::write_bytes_be<std::allocator<unsigned_char>>
              ((basic_bigint<std::allocator<unsigned_char>> *)&n,&signum,&v);
    psVar1 = &this->sink_;
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(psVar1,'\"');
    if (bVar3) {
      string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::push_back(psVar1,'~');
      this->column_ = this->column_ + 1;
    }
    tVar4 = encode_base64<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::string_sink<std::__cxx11::string>>
                      ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_finish,psVar1);
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(psVar1,'\"');
  }
  this->column_ = this->column_ + tVar4 + 2;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  basic_bigint<std::allocator<unsigned_char>_>::destroy(&n);
  return;
}

Assistant:

void write_bigint_value(const string_view_type& sv)
        {
            switch (options_.bignum_format())
            {
                case bignum_format_kind::raw:
                {
                    sink_.append(sv.data(),sv.size());
                    column_ += sv.size();
                    break;
                }
                case bignum_format_kind::base64:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    bool is_neg = n < 0;
                    if (is_neg)
                    {
                        n = - n -1;
                    }
                    int signum;
                    std::vector<uint8_t> v;
                    n.write_bytes_be(signum, v);

                    sink_.push_back('\"');
                    if (is_neg)
                    {
                        sink_.push_back('~');
                        ++column_;
                    }
                    std::size_t length = encode_base64(v.begin(), v.end(), sink_);
                    sink_.push_back('\"');
                    column_ += (length+2);
                    break;
                }
                case bignum_format_kind::base64url:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    bool is_neg = n < 0;
                    if (is_neg)
                    {
                        n = - n -1;
                    }
                    int signum;
                    std::vector<uint8_t> v;
                    n.write_bytes_be(signum, v);

                    sink_.push_back('\"');
                    if (is_neg)
                    {
                        sink_.push_back('~');
                        ++column_;
                    }
                    std::size_t length = encode_base64url(v.begin(), v.end(), sink_);
                    sink_.push_back('\"');
                    column_ += (length+2);
                    break;
                }
                default:
                {
                    sink_.push_back('\"');
                    sink_.append(sv.data(),sv.size());
                    sink_.push_back('\"');
                    column_ += (sv.size() + 2);
                    break;
                }
            }
        }